

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qprocess.cpp
# Opt level: O0

void __thiscall
QProcessPrivate::setError(QProcessPrivate *this,ProcessError error,QString *description)

{
  long lVar1;
  bool bVar2;
  QString *other;
  char *in_RDX;
  uint in_ESI;
  QString *in_RDI;
  long in_FS_OFFSET;
  QString *in_stack_ffffffffffffff58;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  *(char *)((long)&in_RDI[0x1c].d.d + 6) = (char)in_ESI;
  bVar2 = QString::isEmpty((QString *)0x78f818);
  if (bVar2) {
    other = (QString *)(ulong)in_ESI;
    switch(other) {
    case (QString *)0x0:
      QProcess::tr(in_RDX,(char *)in_RDI,0);
      QString::operator=(in_RDI,other);
      QString::~QString((QString *)0x78f88b);
      break;
    case (QString *)0x1:
      QProcess::tr(in_RDX,(char *)in_RDI,0);
      QString::operator=(in_RDI,other);
      QString::~QString((QString *)0x78f8ca);
      break;
    case (QString *)0x2:
      QProcess::tr(in_RDX,(char *)in_RDI,0);
      QString::operator=(in_RDI,other);
      QString::~QString((QString *)0x78f909);
      break;
    case (QString *)0x3:
      QProcess::tr(in_RDX,(char *)in_RDI,0);
      QString::operator=(in_RDI,other);
      QString::~QString((QString *)0x78f948);
      break;
    case (QString *)0x4:
      QProcess::tr(in_RDX,(char *)in_RDI,0);
      QString::operator=(in_RDI,other);
      QString::~QString((QString *)0x78f984);
      break;
    case (QString *)0x5:
      QString::clear(in_RDI);
    }
  }
  else {
    QString::operator=(in_RDI,in_stack_ffffffffffffff58);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != lVar1) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void QProcessPrivate::setError(QProcess::ProcessError error, const QString &description)
{
    processError = error;
    if (description.isEmpty()) {
        switch (error) {
        case QProcess::FailedToStart:
            errorString = QProcess::tr("Process failed to start");
            break;
        case QProcess::Crashed:
            errorString = QProcess::tr("Process crashed");
            break;
        case QProcess::Timedout:
            errorString = QProcess::tr("Process operation timed out");
            break;
        case QProcess::ReadError:
            errorString = QProcess::tr("Error reading from process");
            break;
        case QProcess::WriteError:
            errorString = QProcess::tr("Error writing to process");
            break;
        case QProcess::UnknownError:
            errorString.clear();
            break;
        }
    } else {
        errorString = description;
    }
}